

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

uint * SoapySDRDevice_readRegisters(SoapySDRDevice *device,char *name,uint addr,size_t *length)

{
  size_t sVar1;
  undefined1 *puVar2;
  uint *__dest;
  pointer puVar3;
  allocator local_61;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  string local_48 [32];
  
  sVar1 = *length;
  *length = 0;
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  std::__cxx11::string::string(local_48,name,&local_61);
  (**(code **)(*(long *)device + 0x318))(&local_60,device,local_48,addr,sVar1);
  __dest = callocArrayType<unsigned_int>
                     ((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60._M_impl.super__Vector_impl_data._M_start >> 2);
  puVar3 = local_60._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_60._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60._M_impl.super__Vector_impl_data._M_start != 0) {
    memmove(__dest,local_60._M_impl.super__Vector_impl_data._M_start,
            (long)local_60._M_impl.super__Vector_impl_data._M_finish -
            (long)local_60._M_impl.super__Vector_impl_data._M_start);
    puVar3 = local_60._M_impl.super__Vector_impl_data._M_finish;
  }
  *length = (long)puVar3 - (long)local_60._M_impl.super__Vector_impl_data._M_start >> 2;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::__cxx11::string::~string(local_48);
  return __dest;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned *SoapySDRDevice_readRegisters(const SoapySDRDevice *device, const char *name, const unsigned addr, size_t *length)
{
    const size_t inputLen = *length;
    *length = 0; //clear in case of error

    __SOAPY_SDR_C_TRY
    return toNumericList(device->readRegisters(name, addr, inputLen), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}